

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnemonic.c
# Opt level: O0

int mnemonic_to_bytes(words *w,char *mnemonic,uchar *bytes_out,size_t len,size_t *written)

{
  words *w_00;
  size_t sVar1;
  size_t idx;
  size_t i;
  words *mnemonic_w;
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  char *mnemonic_local;
  words *w_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (((w == (words *)0x0) || (bytes_out == (uchar *)0x0)) || (len == 0)) {
    w_local._4_4_ = -2;
  }
  else {
    w_00 = wordlist_init(mnemonic);
    if (w_00 == (words *)0x0) {
      w_local._4_4_ = -3;
    }
    else {
      if (w_00->len * w->bits + 7 >> 3 <= len) {
        wally_clear(bytes_out,len);
        for (idx = 0; idx < w_00->len; idx = idx + 1) {
          sVar1 = wordlist_lookup_word(w,w_00->indices[idx]);
          if (sVar1 == 0) {
            wordlist_free(w_00);
            wally_clear(bytes_out,len);
            return -2;
          }
          store_index(w->bits,bytes_out,idx,sVar1 - 1);
        }
      }
      if (written != (size_t *)0x0) {
        *written = w_00->len * w->bits + 7 >> 3;
      }
      wordlist_free(w_00);
      w_local._4_4_ = 0;
    }
  }
  return w_local._4_4_;
}

Assistant:

int mnemonic_to_bytes(const struct words *w, const char *mnemonic,
                      unsigned char *bytes_out, size_t len, size_t *written)
{
    struct words *mnemonic_w = NULL;
    size_t i;

    if (written)
        *written = 0;

    if (!w || !bytes_out || !len)
        return WALLY_EINVAL;

    mnemonic_w = wordlist_init(mnemonic);

    if (!mnemonic_w)
        return WALLY_ENOMEM;

    if ((mnemonic_w->len * w->bits + 7u) / 8u > len)
        goto cleanup; /* Return the length we would have written */

    wally_clear(bytes_out, len);

    for (i = 0; i < mnemonic_w->len; ++i) {
        size_t idx = wordlist_lookup_word(w, mnemonic_w->indices[i]);
        if (!idx) {
            wordlist_free(mnemonic_w);
            wally_clear(bytes_out, len);
            return WALLY_EINVAL;
        }
        store_index(w->bits, bytes_out, i, idx - 1);
    }

cleanup:
    if (written)
        *written = (mnemonic_w->len * w->bits + 7u) / 8u;
    wordlist_free(mnemonic_w);
    return WALLY_OK;
}